

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O0

int32_t run_container_read(int32_t cardinality,run_container_t *container,char *buf)

{
  int32_t iVar1;
  char *buf_local;
  run_container_t *container_local;
  int32_t cardinality_local;
  
  *(undefined2 *)&container->n_runs = *(undefined2 *)buf;
  if (container->capacity < container->n_runs) {
    run_container_grow(container,container->n_runs,false);
  }
  if (0 < container->n_runs) {
    memcpy(container->runs,buf + 2,(long)container->n_runs << 2);
  }
  iVar1 = run_container_size_in_bytes(container);
  return iVar1;
}

Assistant:

int32_t run_container_read(int32_t cardinality, run_container_t *container,
                           const char *buf) {
    (void)cardinality;
    memcpy(&container->n_runs, buf, sizeof(uint16_t));
    if (container->n_runs > container->capacity)
        run_container_grow(container, container->n_runs, false);
    if(container->n_runs > 0) {
      memcpy(container->runs, buf + sizeof(uint16_t),
           container->n_runs * sizeof(rle16_t));
    }
    return run_container_size_in_bytes(container);
}